

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtMan.c
# Opt level: O3

Cgt_Man_t * Cgt_ManCreate(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars)

{
  uint uVar1;
  uint uVar2;
  Cgt_Man_t *pCVar3;
  Vec_Vec_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  
  if (0 < pAig->nRegs) {
    Aig_ManFanoutStart(pAig);
    Aig_ManSetCioIds(pAig);
    pCVar3 = (Cgt_Man_t *)calloc(1,0xd8);
    pCVar3->pPars = pPars;
    pCVar3->pAig = pAig;
    uVar1 = pAig->nRegs;
    pVVar4 = (Vec_Vec_t *)malloc(0x10);
    uVar2 = 8;
    if (6 < uVar1 - 1) {
      uVar2 = uVar1;
    }
    pVVar4->nCap = uVar2;
    if (uVar2 == 0) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = (void **)malloc((long)(int)uVar2 << 3);
    }
    pVVar4->pArray = ppvVar5;
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        pvVar6 = calloc(1,0x10);
        ppvVar5[uVar8] = pvVar6;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    pVVar4->nSize = uVar1;
    pCVar3->vGatesAll = pVVar4;
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 1000;
    pVVar7->nSize = 0;
    ppvVar5 = (void **)malloc(8000);
    pVVar7->pArray = ppvVar5;
    pCVar3->vFanout = pVVar7;
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 1000;
    pVVar7->nSize = 0;
    ppvVar5 = (void **)malloc(8000);
    pVVar7->pArray = ppvVar5;
    pCVar3->vVisited = pVVar7;
    pCVar3->nPattWords = 0x10;
    if (pCare != (Aig_Man_t *)0x0) {
      if (pCare->nObjs[2] == pAig->nObjs[2]) {
        pCVar3->pCare = pCare;
        pVVar7 = Aig_ManSupportsInverse(pCare);
        pCVar3->vSuppsInv = (Vec_Vec_t *)pVVar7;
      }
      else {
        printf("The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n");
      }
    }
    return pCVar3;
  }
  __assert_fail("Saig_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtMan.c"
                ,0x31,"Cgt_Man_t *Cgt_ManCreate(Aig_Man_t *, Aig_Man_t *, Cgt_Par_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cgt_Man_t * Cgt_ManCreate( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars )
{
    Cgt_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Cgt_Man_t, 1 ); 
    memset( p, 0, sizeof(Cgt_Man_t) );
    p->pPars      = pPars;
    p->pAig       = pAig;
    p->vGatesAll  = Vec_VecStart( Saig_ManRegNum(pAig) );
    p->vFanout    = Vec_PtrAlloc( 1000 );
    p->vVisited   = Vec_PtrAlloc( 1000 );
    p->nPattWords = 16;
    if ( pCare == NULL )
        return p;
    // check out the constraints
    if ( Aig_ManCiNum(pCare) != Aig_ManCiNum(pAig) )
    {
        printf( "The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n", 
            Aig_ManCiNum(pCare), Aig_ManCiNum(pAig) );
        return p;
    }
    p->pCare = pCare;
    p->vSuppsInv = (Vec_Vec_t *)Aig_ManSupportsInverse( p->pCare );
    return p;
}